

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_a<ncnn::BinaryOp_x86_avx512_functor::binary_op_rsub>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  __m128 _outp_5;
  __m128 _b_5;
  __m256 _outp_4;
  __m256 _b_4;
  __m128 _b1_2;
  __m128 _b0_2;
  __m512 _outp_3;
  __m512 _b_3;
  __m256 _b23;
  __m256 _b01;
  __m128 _b3;
  __m128 _b2;
  __m128 _b1_1;
  __m128 _b0_1;
  __m512 _p_512_1;
  __m256 _p_256;
  __m128 _p_2;
  int i_2;
  __m256 _outp_2;
  __m256 _b_2;
  __m512 _outp_1;
  __m512 _b_1;
  __m256 _b1;
  __m256 _b0;
  __m512 _p_512;
  __m256 _p_1;
  int i_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int i;
  binary_op_rsub op;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  int local_b04;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  int local_984;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 uStack_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  int local_8b0;
  undefined8 *local_8a0;
  uint *local_898;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  
  local_8a0 = in_RDX;
  local_898 = in_RSI;
  if (in_R8D == 0x10) {
    local_8b0 = 0;
    auVar16 = *in_RDI;
    for (; local_8b0 < in_ECX; local_8b0 = local_8b0 + 1) {
      auVar15 = vbroadcastss_avx512f(ZEXT416(*local_898));
      auVar15 = vsubps_avx512f(auVar15,auVar16);
      local_980 = auVar15._0_8_;
      uStack_978 = auVar15._8_8_;
      uStack_970 = auVar15._16_8_;
      uStack_968 = auVar15._24_8_;
      uStack_960 = auVar15._32_8_;
      uStack_958 = auVar15._40_8_;
      uStack_950 = auVar15._48_8_;
      uStack_948 = auVar15._56_8_;
      *local_8a0 = local_980;
      local_8a0[1] = uStack_978;
      local_8a0[2] = uStack_970;
      local_8a0[3] = uStack_968;
      local_8a0[4] = uStack_960;
      local_8a0[5] = uStack_958;
      local_8a0[6] = uStack_950;
      local_8a0[7] = uStack_948;
      local_898 = local_898 + 1;
      local_8a0 = local_8a0 + 8;
    }
  }
  if (in_R8D == 8) {
    local_984 = 0;
    auVar8 = *(undefined1 (*) [32])*in_RDI;
    auVar16 = vinsertf64x4_avx512f
                        (ZEXT3264(*(undefined1 (*) [32])*in_RDI),*(undefined1 (*) [32])*in_RDI,1);
    for (; local_984 + 1 < in_ECX; local_984 = local_984 + 2) {
      uVar1 = *local_898;
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
      uStack_450 = auVar5._0_8_;
      uStack_448 = auVar5._8_8_;
      uVar1 = local_898[1];
      auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
      auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
      uStack_410 = auVar6._0_8_;
      uStack_408 = auVar6._8_8_;
      auVar7._16_8_ = uStack_410;
      auVar7._0_16_ = auVar5;
      auVar7._24_8_ = uStack_408;
      auVar15 = vinsertf64x4_avx512f
                          (ZEXT3264(CONCAT824(uStack_448,CONCAT816(uStack_450,auVar4))),auVar7,1);
      auVar15 = vsubps_avx512f(auVar15,auVar16);
      local_ac0 = auVar15._0_8_;
      uStack_ab8 = auVar15._8_8_;
      uStack_ab0 = auVar15._16_8_;
      uStack_aa8 = auVar15._24_8_;
      uStack_aa0 = auVar15._32_8_;
      uStack_a98 = auVar15._40_8_;
      uStack_a90 = auVar15._48_8_;
      uStack_a88 = auVar15._56_8_;
      *local_8a0 = local_ac0;
      local_8a0[1] = uStack_ab8;
      local_8a0[2] = uStack_ab0;
      local_8a0[3] = uStack_aa8;
      local_8a0[4] = uStack_aa0;
      local_8a0[5] = uStack_a98;
      local_8a0[6] = uStack_a90;
      local_8a0[7] = uStack_a88;
      local_898 = local_898 + 2;
      local_8a0 = local_8a0 + 8;
    }
    for (; local_984 < in_ECX; local_984 = local_984 + 1) {
      uVar1 = *local_898;
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
      uStack_3d0 = auVar4._0_8_;
      uStack_3c8 = auVar4._8_8_;
      auVar14._16_8_ = uStack_3d0;
      auVar14._0_16_ = auVar5;
      auVar14._24_8_ = uStack_3c8;
      auVar7 = vsubps_avx(auVar14,auVar8);
      local_b00 = auVar7._0_8_;
      uStack_af8 = auVar7._8_8_;
      uStack_af0 = auVar7._16_8_;
      uStack_ae8 = auVar7._24_8_;
      *local_8a0 = local_b00;
      local_8a0[1] = uStack_af8;
      local_8a0[2] = uStack_af0;
      local_8a0[3] = uStack_ae8;
      local_898 = local_898 + 1;
      local_8a0 = local_8a0 + 4;
    }
  }
  if (in_R8D == 4) {
    local_b04 = 0;
    uVar9 = *(undefined8 *)*in_RDI;
    uVar10 = *(undefined8 *)(*in_RDI + 8);
    auVar5 = *(undefined1 (*) [16])*in_RDI;
    auVar4 = *(undefined1 (*) [16])*in_RDI;
    auVar8._16_8_ = uVar9;
    auVar8._0_16_ = *(undefined1 (*) [16])*in_RDI;
    auVar8._24_8_ = uVar10;
    auVar16 = vinsertf64x4_avx512f
                        (ZEXT3264(CONCAT824(uVar10,CONCAT816(uVar9,*(undefined1 (*) [16])*in_RDI))),
                         auVar8,1);
    for (; local_b04 + 3 < in_ECX; local_b04 = local_b04 + 4) {
      uVar1 = *local_898;
      uVar2 = local_898[1];
      uVar3 = local_898[2];
      auVar11._4_4_ = uVar3;
      auVar11._0_4_ = uVar3;
      auVar11._12_4_ = uVar3;
      auVar11._8_4_ = uVar3;
      uVar3 = local_898[3];
      auVar11._20_4_ = uVar3;
      auVar11._16_4_ = uVar3;
      auVar11._28_4_ = uVar3;
      auVar11._24_4_ = uVar3;
      auVar15 = vinsertf64x4_avx512f
                          (ZEXT3264(CONCAT824(CONCAT44(uVar2,uVar2),
                                              CONCAT816(CONCAT44(uVar2,uVar2),
                                                        CONCAT88(CONCAT44(uVar1,uVar1),
                                                                 CONCAT44(uVar1,uVar1))))),auVar11,1
                          );
      auVar15 = vsubps_avx512f(auVar15,auVar16);
      local_c80 = auVar15._0_8_;
      uStack_c78 = auVar15._8_8_;
      uStack_c70 = auVar15._16_8_;
      uStack_c68 = auVar15._24_8_;
      uStack_c60 = auVar15._32_8_;
      uStack_c58 = auVar15._40_8_;
      uStack_c50 = auVar15._48_8_;
      uStack_c48 = auVar15._56_8_;
      *local_8a0 = local_c80;
      local_8a0[1] = uStack_c78;
      local_8a0[2] = uStack_c70;
      local_8a0[3] = uStack_c68;
      local_8a0[4] = uStack_c60;
      local_8a0[5] = uStack_c58;
      local_8a0[6] = uStack_c50;
      local_8a0[7] = uStack_c48;
      local_898 = local_898 + 4;
      local_8a0 = local_8a0 + 8;
    }
    for (; local_b04 + 1 < in_ECX; local_b04 = local_b04 + 2) {
      uVar1 = *local_898;
      auVar12._4_4_ = uVar1;
      auVar12._0_4_ = uVar1;
      auVar12._12_4_ = uVar1;
      auVar12._8_4_ = uVar1;
      uVar1 = local_898[1];
      auVar12._20_4_ = uVar1;
      auVar12._16_4_ = uVar1;
      auVar12._28_4_ = uVar1;
      auVar12._24_4_ = uVar1;
      auVar13._16_8_ = uVar9;
      auVar13._0_16_ = auVar4;
      auVar13._24_8_ = uVar10;
      auVar8 = vsubps_avx(auVar12,auVar13);
      local_ce0 = auVar8._0_8_;
      uStack_cd8 = auVar8._8_8_;
      uStack_cd0 = auVar8._16_8_;
      uStack_cc8 = auVar8._24_8_;
      *local_8a0 = local_ce0;
      local_8a0[1] = uStack_cd8;
      local_8a0[2] = uStack_cd0;
      local_8a0[3] = uStack_cc8;
      local_898 = local_898 + 2;
      local_8a0 = local_8a0 + 4;
    }
    for (; local_b04 < in_ECX; local_b04 = local_b04 + 1) {
      uVar1 = *local_898;
      auVar4._4_4_ = uVar1;
      auVar4._0_4_ = uVar1;
      auVar4._12_4_ = uVar1;
      auVar4._8_4_ = uVar1;
      auVar4 = vsubps_avx(auVar4,auVar5);
      local_d00 = auVar4._0_8_;
      uStack_cf8 = auVar4._8_8_;
      *local_8a0 = local_d00;
      local_8a0[1] = uStack_cf8;
      local_898 = local_898 + 1;
      local_8a0 = local_8a0 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_a(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        __m512 _p = _mm512_loadu_ps(ptr);
        for (; i < w; i++)
        {
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
        __m256 _p = _mm256_loadu_ps(ptr);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p), _p, 1);
        for (; i + 1 < w; i += 2)
        {
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
        __m128 _p = _mm_loadu_ps(ptr);
#if __AVX__
        __m256 _p_256 = _mm256_insertf128_ps(_mm256_castps128_ps256(_p), _p, 1);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p_256), _p_256, 1);
        for (; i + 3 < w; i += 4)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p_256, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}